

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile_common.c
# Opt level: O0

int av1_is_min_tile_width_satisfied(AV1_COMMON *cm)

{
  int iVar1;
  int iVar2;
  AV1_COMMON *in_RDI;
  uint local_4;
  
  if ((in_RDI->tiles).cols == 1) {
    local_4 = 1;
  }
  else {
    iVar1 = (in_RDI->tiles).min_inner_width;
    iVar2 = av1_superres_scaled(in_RDI);
    local_4 = (uint)(0x40 << ((byte)iVar2 & 0x1f) <= iVar1 << 2);
  }
  return local_4;
}

Assistant:

int av1_is_min_tile_width_satisfied(const AV1_COMMON *cm) {
  // Disable check if there is a single tile col in the frame
  if (cm->tiles.cols == 1) return 1;

  return ((cm->tiles.min_inner_width << MI_SIZE_LOG2) >=
          (64 << av1_superres_scaled(cm)));
}